

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O1

void __thiscall
despot::Pocman::MoveGhostAggressive(Pocman *this,PocmanState *pocstate,int g,Random *random)

{
  pointer pCVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int dir;
  long lVar5;
  double dVar6;
  undefined4 local_48;
  int local_44;
  ulong local_40;
  
  dVar6 = (double)despot::Random::NextDouble();
  if (this->chase_prob_ <= dVar6 && dVar6 != this->chase_prob_) {
    MoveGhostRandom(this,pocstate,g,random);
    return;
  }
  local_44 = (this->maze_).ysize_ + (this->maze_).xsize_;
  lVar5 = (long)g;
  pCVar1 = (pocstate->ghost_pos).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_48 = *(undefined4 *)(pCVar1 + lVar5 * 8);
  local_40 = (ulong)*(uint *)(pCVar1 + lVar5 * 8 + 4);
  dir = 0;
  do {
    iVar2 = despot::Coord::DirectionalDistance
                      (*(undefined8 *)&pocstate->pocman_pos,
                       *(undefined8 *)
                        ((pocstate->ghost_pos).
                         super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar5 * 8),dir);
    uVar4 = NextPos(this,(pocstate->ghost_pos).
                         super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar5 * 8,dir);
    if ((uVar4 & 0x8000000080000000) == 0 && iVar2 <= local_44) {
      iVar3 = despot::Compass::Opposite(dir);
      if (iVar3 != (pocstate->ghost_dir).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5]) {
        local_40 = uVar4 >> 0x20;
        local_48 = (undefined4)uVar4;
        local_44 = iVar2;
      }
    }
    dir = dir + 1;
  } while (dir != 4);
  pCVar1 = (pocstate->ghost_pos).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)(pCVar1 + lVar5 * 8) = local_48;
  *(int *)(pCVar1 + lVar5 * 8 + 4) = (int)local_40;
  (pocstate->ghost_dir).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar5] = -1;
  return;
}

Assistant:

void Pocman::MoveGhostAggressive(PocmanState& pocstate, int g,
	Random &random) const {
	if (random.NextDouble() > chase_prob_) {
		MoveGhostRandom(pocstate, g, random);
		return;
	}

	int bestDist = maze_.xsize() + maze_.ysize();
	Coord bestPos = pocstate.ghost_pos[g];
	int bestDir = -1;
	for (int dir = 0; dir < 4; dir++) {
		int dist = Coord::DirectionalDistance(pocstate.pocman_pos,
			pocstate.ghost_pos[g], dir);
		Coord newpos = NextPos(pocstate.ghost_pos[g], dir);
		if (dist <= bestDist && newpos.x >= 0 && newpos.y >= 0
			&& Compass::Opposite(dir) != pocstate.ghost_dir[g]) {
			bestDist = dist;
			bestPos = newpos;
		}
	}

	pocstate.ghost_pos[g] = bestPos;
	pocstate.ghost_dir[g] = bestDir;
}